

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash.h
# Opt level: O0

uint32 crnlib::bitmix32c(uint32 a)

{
  int iVar1;
  uint uVar2;
  uint32 a_local;
  
  uVar2 = a * 0x1001 + 0x7ed55d16;
  iVar1 = (uVar2 ^ 0xc761c23c ^ uVar2 >> 0x13) * 0x21;
  uVar2 = (iVar1 + 0xe9f8cc1dU ^ (iVar1 + 0x165667b1) * 0x200) * 9 + 0xfd7046c5;
  return uVar2 ^ 0xb55a4f09 ^ uVar2 >> 0x10;
}

Assistant:

inline uint32 bitmix32c(uint32 a)
    {
        a = (a + 0x7ed55d16) + (a << 12);
        a = (a ^ 0xc761c23c) ^ (a >> 19);
        a = (a + 0x165667b1) + (a << 5);
        a = (a + 0xd3a2646c) ^ (a << 9);
        a = (a + 0xfd7046c5) + (a << 3);
        a = (a ^ 0xb55a4f09) ^ (a >> 16);
        return a;
    }